

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O3

void TestOneTruncate(char *path,int64 limit,int64 keep,int64 dsize,int64 ksize,int64 expect)

{
  LogMessageData *pLVar1;
  int __fd;
  int iVar2;
  long lVar3;
  ssize_t sVar4;
  __off_t _Var5;
  void *__buf;
  ostream *poVar6;
  LogMessageData *pLVar7;
  long lVar8;
  SendMethod send_method;
  undefined1 *__size;
  stat statbuf;
  LogMessage local_100;
  CheckOpString local_f0;
  undefined8 uStack_e8;
  char *local_e0;
  int64 local_d8;
  int64 local_d0;
  LogMessageData *local_c8;
  stat local_c0;
  
  send_method = expect;
  local_e0 = path;
  __fd = open(path,0x242,0x180);
  if (__fd == -1) {
    local_100.allocated_ = (LogMessageData *)google::LogMessage::SendToLog;
    local_100.data_ = (LogMessageData *)0x0;
    google::ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&local_c0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x308,3,0,send_method);
    poVar6 = google::LogMessage::stream((LogMessage *)&local_c0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"fd = open(path, O_RDWR | O_CREAT | O_TRUNC, 0600)",0x31);
    google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_c0);
  }
  local_d8 = limit;
  local_d0 = keep;
  local_c8 = (LogMessageData *)expect;
  if (0 < dsize) {
    lVar8 = 0;
    do {
      lVar3 = dsize - lVar8;
      if (9 < lVar3) {
        lVar3 = 10;
      }
      sVar4 = write(__fd,"DISCARDME!",(long)(int)lVar3);
      if (sVar4 == -1) {
        local_100.allocated_ = (LogMessageData *)google::LogMessage::SendToLog;
        local_100.data_ = (LogMessageData *)0x0;
        google::ErrnoLogMessage::ErrnoLogMessage
                  ((ErrnoLogMessage *)&local_c0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                   ,0x311,3,0,send_method);
        poVar6 = google::LogMessage::stream((LogMessage *)&local_c0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"write(fd, discardstr, bytes)",0x1c);
        google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_c0);
      }
      lVar8 = lVar8 + (int)lVar3;
    } while (lVar8 < dsize);
  }
  if (0 < ksize) {
    lVar8 = 0;
    do {
      lVar3 = ksize - lVar8;
      if (6 < lVar3) {
        lVar3 = 7;
      }
      sVar4 = write(__fd,"KEEPME!",(long)(int)lVar3);
      if (sVar4 == -1) {
        local_100.allocated_ = (LogMessageData *)google::LogMessage::SendToLog;
        local_100.data_ = (LogMessageData *)0x0;
        google::ErrnoLogMessage::ErrnoLogMessage
                  ((ErrnoLogMessage *)&local_c0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                   ,0x317,3,0,send_method);
        poVar6 = google::LogMessage::stream((LogMessage *)&local_c0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"write(fd, keepstr, bytes)",0x19);
        google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_c0);
      }
      lVar8 = lVar8 + (int)lVar3;
    } while (lVar8 < ksize);
  }
  google::TruncateLogFile(local_e0,local_d8,local_d0);
  iVar2 = fstat(__fd,&local_c0);
  pLVar1 = local_c8;
  if (iVar2 == -1) {
    local_f0.str_ = (string *)google::LogMessage::SendToLog;
    uStack_e8 = 0;
    google::ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&local_100,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,799,3,0,send_method);
    poVar6 = google::LogMessage::stream(&local_100);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"fstat(fd, &statbuf)",0x13);
    google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_100);
  }
  local_100.allocated_ = (LogMessageData *)local_c0.st_size;
  local_f0.str_ = (string *)pLVar1;
  if (((LogMessageData *)local_c0.st_size != pLVar1) &&
     (pLVar7 = (LogMessageData *)
               google::MakeCheckOpString<long,long>
                         ((long *)&local_100,(long *)&local_f0,"statbuf.st_size == expect"),
     pLVar7 != (LogMessageData *)0x0)) {
    local_f0.str_ = (string *)pLVar7;
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_100,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,800,&local_f0);
    google::LogMessage::stream(&local_100);
LAB_0011a8e4:
    google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_100);
  }
  _Var5 = lseek(__fd,0,0);
  if (_Var5 == -1) {
    local_f0.str_ = (string *)google::LogMessage::SendToLog;
    uStack_e8 = 0;
    google::ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&local_100,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x321,3,0,send_method);
    poVar6 = google::LogMessage::stream(&local_100);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"lseek(fd, 0, SEEK_SET)",0x16);
    google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_100);
  }
  __size = (undefined1 *)((long)&((_Alloc_hider *)local_c0.st_size)->_M_p + 1);
  if (google::g_new_hook != (code *)0x0) {
    (*google::g_new_hook)();
  }
  __buf = calloc(1,(size_t)__size);
  sVar4 = read(__fd,__buf,(size_t)__size);
  if (sVar4 == -1) {
    local_f0.str_ = (string *)google::LogMessage::SendToLog;
    uStack_e8 = 0;
    google::ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&local_100,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x327,3,0,send_method);
    poVar6 = google::LogMessage::stream(&local_100);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"read(fd, buf, buf_size)",0x17);
    google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_100);
  }
  if (0 < (long)pLVar1) {
    lVar8 = 0;
    do {
      lVar3 = (long)pLVar1 - lVar8;
      if (6 < lVar3) {
        lVar3 = 7;
      }
      iVar2 = bcmp(__buf,"KEEPME!",(long)(int)lVar3);
      if (iVar2 != 0) {
        google::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_100,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                   ,0x32d);
        poVar6 = google::LogMessage::stream(&local_100);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"Check failed: !memcmp(p, keepstr, bytes) ",0x29);
        goto LAB_0011a8e4;
      }
      lVar8 = lVar8 + (int)lVar3;
    } while (lVar8 < (long)pLVar1);
  }
  close(__fd);
  free(__buf);
  return;
}

Assistant:

static void TestOneTruncate(const char *path, int64 limit, int64 keep,
                            int64 dsize, int64 ksize, int64 expect) {
  int fd;
  CHECK_ERR(fd = open(path, O_RDWR | O_CREAT | O_TRUNC, 0600));

  const char *discardstr = "DISCARDME!", *keepstr = "KEEPME!";
  const size_t discard_size = strlen(discardstr), keep_size = strlen(keepstr);

  // Fill the file with the requested data; first discard data, then kept data
  int64 written = 0;
  while (written < dsize) {
    int bytes = min<int64>(dsize - written, discard_size);
    CHECK_ERR(write(fd, discardstr, bytes));
    written += bytes;
  }
  written = 0;
  while (written < ksize) {
    int bytes = min<int64>(ksize - written, keep_size);
    CHECK_ERR(write(fd, keepstr, bytes));
    written += bytes;
  }

  TruncateLogFile(path, limit, keep);

  // File should now be shorter
  struct stat statbuf;
  CHECK_ERR(fstat(fd, &statbuf));
  CHECK_EQ(statbuf.st_size, expect);
  CHECK_ERR(lseek(fd, 0, SEEK_SET));

  // File should contain the suffix of the original file
  const size_t buf_size = statbuf.st_size + 1;
  char* buf = new char[buf_size];
  memset(buf, 0, buf_size);
  CHECK_ERR(read(fd, buf, buf_size));

  const char *p = buf;
  int64 checked = 0;
  while (checked < expect) {
    int bytes = min<int64>(expect - checked, keep_size);
    CHECK(!memcmp(p, keepstr, bytes));
    checked += bytes;
  }
  close(fd);
  delete[] buf;
}